

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::buffer<char>::append<char>(buffer<char> *this,char *begin,char *end)

{
  _func_int ***ppp_Var1;
  type tVar2;
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  size_t new_size;
  size_t in_stack_ffffffffffffffb8;
  buffer<char> *this_00;
  
  this_00 = *(buffer<char> **)(in_RDI + 0x10);
  tVar2 = to_unsigned<long>((long)in_RDX - (long)in_RSI);
  ppp_Var1 = &this_00->_vptr_buffer;
  reserve(this_00,in_stack_ffffffffffffffb8);
  make_checked<char>(*(char **)(in_RDI + 8),*(size_t *)(in_RDI + 0x18));
  std::uninitialized_copy<char_const*,char*>(in_RDX,in_RSI,(char *)this_00);
  *(type *)(in_RDI + 0x10) = (long)ppp_Var1 + tVar2;
  return;
}

Assistant:

void buffer<T>::append(const U* begin, const U* end) {
  std::size_t new_size = size_ + to_unsigned(end - begin);
  reserve(new_size);
  std::uninitialized_copy(begin, end, make_checked(ptr_, capacity_) + size_);
  size_ = new_size;
}